

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

bool __thiscall
server_context::can_be_detokenized
          (server_context *this,llama_context *ctx,vector<int,_std::allocator<int>_> *tokens)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  undefined8 uVar5;
  bool bVar6;
  vector<int,_std::allocator<int>_> *__range1;
  int *piVar7;
  
  uVar5 = llama_get_model(ctx);
  uVar5 = llama_model_get_vocab(uVar5);
  iVar4 = llama_vocab_n_tokens(uVar5);
  piVar2 = (tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar2 == piVar3) {
    bVar6 = true;
  }
  else {
    do {
      piVar7 = piVar2 + 1;
      iVar1 = *piVar2;
      bVar6 = iVar1 < iVar4 && -1 < iVar1;
      if (iVar1 >= iVar4 || -1 >= iVar1) {
        return bVar6;
      }
      piVar2 = piVar7;
    } while (piVar7 != piVar3);
  }
  return bVar6;
}

Assistant:

bool can_be_detokenized(const struct llama_context * ctx, const std::vector<llama_token> & tokens) {
        const llama_model * model = llama_get_model(ctx);
        const llama_vocab * vocab = llama_model_get_vocab(model);
        const int32_t n_vocab = llama_vocab_n_tokens(vocab);
        for (const auto & token : tokens) {
            if (token < 0 || token >= n_vocab) {
                return false;
            }
        }
        return true;
    }